

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrNSImpl.cpp
# Opt level: O2

void __thiscall xercesc_4_0::DOMAttrNSImpl::setPrefix(DOMAttrNSImpl *this,XMLCh *prefix)

{
  DOMDocument *pDVar1;
  bool bVar2;
  int iVar3;
  XMLCh *pXVar4;
  XMLCh *pXVar5;
  XMLCh *str2;
  XMLCh *str2_00;
  XMLSize_t XVar6;
  XMLSize_t XVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  DOMException *this_00;
  undefined4 extraout_var_05;
  undefined8 *puVar8;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  ulong uVar9;
  DOMDocumentImpl *this_01;
  XMLCh temp [256];
  
  pXVar4 = DOMNodeImpl::getXmlnsString();
  if (((this->super_DOMAttrImpl).fNode.flags & 1) == 0) {
    if (((this->fNamespaceURI == (XMLCh *)0x0) || (*this->fNamespaceURI == L'\0')) ||
       (bVar2 = XMLString::equals(this->fLocalName,pXVar4), bVar2)) {
      this_00 = (DOMException *)__cxa_allocate_exception(0x28);
      iVar3 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
      if (CONCAT44(extraout_var_00,iVar3) == 0) {
        puVar8 = &XMLPlatformUtils::fgMemoryManager;
      }
      else {
        iVar3 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
        puVar8 = (undefined8 *)(CONCAT44(extraout_var_02,iVar3) + 0x158);
      }
      DOMException::DOMException(this_00,0xe,0,(MemoryManager *)*puVar8);
    }
    else {
      if ((prefix == (XMLCh *)0x0) || (*prefix == L'\0')) {
        (this->super_DOMAttrImpl).fName = this->fLocalName;
        this->fPrefix = (XMLCh *)0x0;
        return;
      }
      pDVar1 = (this->super_DOMAttrImpl).fParent.fOwnerDocument;
      this_01 = (DOMDocumentImpl *)&pDVar1[-1].super_DOMNode;
      if (pDVar1 == (DOMDocument *)0x0) {
        this_01 = (DOMDocumentImpl *)0x0;
      }
      bVar2 = DOMDocumentImpl::isXMLName(this_01,prefix);
      if (bVar2) {
        pXVar5 = DOMNodeImpl::getXmlString();
        str2 = DOMNodeImpl::getXmlURIString();
        str2_00 = DOMNodeImpl::getXmlnsURIString();
        bVar2 = XMLString::equals(prefix,pXVar5);
        if (((bVar2) && (bVar2 = XMLString::equals(this->fNamespaceURI,str2), !bVar2)) ||
           ((bVar2 = XMLString::equals(prefix,pXVar4), bVar2 &&
            (bVar2 = XMLString::equals(this->fNamespaceURI,str2_00), !bVar2)))) {
          this_00 = (DOMException *)__cxa_allocate_exception(0x28);
          iVar3 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
          if (CONCAT44(extraout_var_04,iVar3) == 0) {
            puVar8 = &XMLPlatformUtils::fgMemoryManager;
          }
          else {
            iVar3 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])
                              (this);
            puVar8 = (undefined8 *)(CONCAT44(extraout_var_08,iVar3) + 0x158);
          }
          DOMException::DOMException(this_00,0xe,0,(MemoryManager *)*puVar8);
        }
        else {
          iVar3 = XMLString::indexOf(prefix,L':');
          if (iVar3 == -1) {
            pXVar4 = DOMDocumentImpl::getPooledString(this_01,prefix);
            this->fPrefix = pXVar4;
            XVar6 = XMLString::stringLen(prefix);
            XVar7 = XMLString::stringLen(this->fLocalName);
            uVar9 = XVar7 + XVar6 + 1;
            if (uVar9 < 0xff) {
              pXVar4 = temp;
            }
            else {
              iVar3 = (*this_01->fMemoryManager->_vptr_MemoryManager[3])
                                (this_01->fMemoryManager,uVar9 * 2);
              pXVar4 = (XMLCh *)CONCAT44(extraout_var,iVar3);
            }
            XMLString::copyString(pXVar4,prefix);
            pXVar4[XVar6] = L':';
            XMLString::copyString(pXVar4 + XVar6 + 1,this->fLocalName);
            pXVar5 = DOMDocumentImpl::getPooledString(this_01,pXVar4);
            (this->super_DOMAttrImpl).fName = pXVar5;
            if (0xfe < uVar9) {
              (*this_01->fMemoryManager->_vptr_MemoryManager[4])(this_01->fMemoryManager,pXVar4);
            }
            return;
          }
          this_00 = (DOMException *)__cxa_allocate_exception(0x28);
          iVar3 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
          if (CONCAT44(extraout_var_05,iVar3) == 0) {
            puVar8 = &XMLPlatformUtils::fgMemoryManager;
          }
          else {
            iVar3 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])
                              (this);
            puVar8 = (undefined8 *)(CONCAT44(extraout_var_09,iVar3) + 0x158);
          }
          DOMException::DOMException(this_00,0xe,0,(MemoryManager *)*puVar8);
        }
      }
      else {
        this_00 = (DOMException *)__cxa_allocate_exception(0x28);
        iVar3 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
        if (CONCAT44(extraout_var_03,iVar3) == 0) {
          puVar8 = &XMLPlatformUtils::fgMemoryManager;
        }
        else {
          iVar3 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
          puVar8 = (undefined8 *)(CONCAT44(extraout_var_07,iVar3) + 0x158);
        }
        DOMException::DOMException(this_00,5,0,(MemoryManager *)*puVar8);
      }
    }
  }
  else {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    iVar3 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
    if (CONCAT44(extraout_var_01,iVar3) == 0) {
      puVar8 = &XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar3 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
      puVar8 = (undefined8 *)(CONCAT44(extraout_var_06,iVar3) + 0x158);
    }
    DOMException::DOMException(this_00,7,0,(MemoryManager *)*puVar8);
  }
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

void DOMAttrNSImpl::setPrefix(const XMLCh *prefix)
{
    const XMLCh * xmlns = DOMNodeImpl::getXmlnsString();

    if (fNode.isReadOnly())
        throw DOMException(DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMNodeMemoryManager);
    if (fNamespaceURI == 0 || fNamespaceURI[0] == chNull || XMLString::equals(fLocalName, xmlns))
        throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);

    if (prefix == 0 || prefix[0] == chNull) {
        fName = fLocalName;
        fPrefix = 0;
        return;
    }

    DOMDocumentImpl* doc = (DOMDocumentImpl*) fParent.fOwnerDocument;

    if (!doc->isXMLName(prefix))
        throw DOMException(DOMException::INVALID_CHARACTER_ERR,0, GetDOMNodeMemoryManager);

    const XMLCh * xml = DOMNodeImpl::getXmlString();
    const XMLCh * xmlURI = DOMNodeImpl::getXmlURIString();
    const XMLCh * xmlnsURI = DOMNodeImpl::getXmlnsURIString();

    if ((XMLString::equals(prefix, xml) &&
         !XMLString::equals(fNamespaceURI, xmlURI))
        || (XMLString::equals(prefix, xmlns) &&
            !XMLString::equals(fNamespaceURI, xmlnsURI)))
        throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);

    if (XMLString::indexOf(prefix, chColon) != -1) {
        throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);
    }

    this-> fPrefix = doc->getPooledString(prefix);

    XMLSize_t prefixLen = XMLString::stringLen(prefix);
    XMLSize_t newQualifiedNameLen = prefixLen+1+XMLString::stringLen(fLocalName);
    XMLCh* newName;
    XMLCh temp[256];
    if (newQualifiedNameLen >= 255)
        newName = (XMLCh*) doc->getMemoryManager()->allocate
        (
            newQualifiedNameLen * sizeof(XMLCh)
        );//new XMLCh[newQualifiedNameLen];
    else
        newName = temp;

    // newName = prefix + chColon + fLocalName;
    XMLString::copyString(newName, prefix);
    newName[prefixLen] = chColon;
    XMLString::copyString(&newName[prefixLen+1], fLocalName);

    fName = doc->getPooledString(newName);

    if (newQualifiedNameLen >= 255)
      doc->getMemoryManager()->deallocate(newName);//delete[] newName;

}